

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_GLYPH(effect_handler_context_t_conflict *context)

{
  ushort uVar1;
  loc grid;
  loc grid_00;
  loc grid_01;
  _Bool _Var2;
  loc lVar3;
  object *poVar4;
  char *fmt;
  
  lVar3 = cave_find_decoy(cave);
  uVar1 = cave->feeling_squares;
  context->ident = true;
  _Var2 = loc_is_zero((loc_conflict)lVar3);
  if ((_Var2) || (context->subtype != 2)) {
    if ((uVar1 < 0x400) || (context->subtype != 1)) {
      lVar3.x = (player->grid).x;
      lVar3.y = (player->grid).y;
      _Var2 = square_istrappable(cave,lVar3);
      if (_Var2) {
        grid.x = (player->grid).x;
        grid.y = (player->grid).y;
        poVar4 = square_object(cave,grid);
        if (poVar4 != (object *)0x0) {
          grid_00.x = (player->grid).x;
          grid_00.y = (player->grid).y;
          push_object(grid_00);
        }
        grid_01.x = (player->grid).x;
        grid_01.y = (player->grid).y;
        square_add_glyph(cave,grid_01,context->subtype);
        return true;
      }
      fmt = "There is no clear floor on which to cast the spell.";
    }
    else {
      fmt = "You can only lay four glyphs at a time.";
    }
  }
  else {
    fmt = "You can only deploy one decoy at a time.";
  }
  msg(fmt);
  return false;
}

Assistant:

bool effect_handler_GLYPH(effect_handler_context_t *context)
{
	struct loc decoy = cave_find_decoy(cave);
	int num_runes = cave->feeling_squares >> 8;

	/* Always notice */
	context->ident = true;

	/* Only one decoy at a time */
	if (!loc_is_zero(decoy) && (context->subtype == GLYPH_DECOY)) {
		msg("You can only deploy one decoy at a time.");
		return false;
	}

	/* No more than four glyphs at a time */
	if ((num_runes >= 4) && (context->subtype == GLYPH_WARDING)) {
		msg("You can only lay four glyphs at a time.");
		return false;
	}

	/* See if the effect works */
	if (!square_istrappable(cave, player->grid)) {
		msg("There is no clear floor on which to cast the spell.");
		return false;
	}

	/* Push objects off the grid */
	if (square_object(cave, player->grid))
		push_object(player->grid);

	/* Create a glyph */
	square_add_glyph(cave, player->grid, context->subtype);

	return true;
}